

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
gtl::
dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
::assert_key_is_not_empty_or_deleted<unsigned_int>
          (dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
           *this,uint *key)

{
  bool bVar1;
  
  if ((this->settings).
      super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
      .use_empty_ == false) {
    __assert_fail("settings.use_empty() && \"set_empty_key() was not called\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x3f4,
                  "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::assert_key_is_not_empty_or_deleted(const K &) const [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>, K = unsigned int]"
                 );
  }
  bVar1 = KeyInfo::equals<unsigned_int>(&this->key_info,key,&(this->key_info).empty);
  if (!bVar1) {
    if ((this->settings).
        super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
        .use_deleted_ == true) {
      bVar1 = KeyInfo::equals<unsigned_int>(&this->key_info,key,&(this->key_info).delkey);
      if (bVar1) {
        __assert_fail("(!settings.use_deleted() || !equals(key, key_info.delkey)) && \"Using the deleted key as a regular key\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                      ,0x3f8,
                      "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::assert_key_is_not_empty_or_deleted(const K &) const [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>, K = unsigned int]"
                     );
      }
    }
    return;
  }
  __assert_fail("!equals(key, key_info.empty) && \"Using the empty key as a regular key\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                ,0x3f6,
                "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::assert_key_is_not_empty_or_deleted(const K &) const [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>, K = unsigned int]"
               );
}

Assistant:

void assert_key_is_not_empty_or_deleted(const K& key) const {
    assert(settings.use_empty() && "set_empty_key() was not called");
    assert(!equals(key, key_info.empty) &&
           "Using the empty key as a regular key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey))
           && "Using the deleted key as a regular key");
  }